

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O0

int __thiscall MixerContext::auto_matrix(MixerContext *this)

{
  bool bVar1;
  double *pdVar2;
  int *in_RDI;
  uint32_t j_2;
  uint32_t i_3;
  uint32_t j_1;
  uint32_t i_2;
  uint32_t j;
  int in_i;
  double sum;
  uint32_t i_1;
  uint32_t out_i;
  cubeb_channel_layout unaccounted;
  uint32_t i;
  cubeb_channel_layout out_ch_layout;
  cubeb_channel_layout in_ch_layout;
  float maxval;
  double maxcoef;
  double matrix [18] [18];
  bool local_a89;
  uint local_a80;
  uint local_a7c;
  uint local_a78;
  uint local_a74;
  uint local_a70;
  int local_a6c;
  double local_a68;
  uint local_a5c;
  uint local_a58;
  uint local_a54;
  uint local_a50;
  cubeb_channel_layout local_a4c;
  cubeb_channel_layout local_a48;
  float local_a44;
  double local_a40;
  double local_a38 [326];
  int local_4;
  
  memset(local_a38,0,0xa20);
  local_a40 = 0.0;
  local_a48 = clean_layout(0x141bc3);
  local_a4c = clean_layout(0x141bd6);
  bVar1 = sane_layout(0x141be3);
  if (bVar1) {
    bVar1 = sane_layout(0x141c4b);
    if (bVar1) {
      for (local_a50 = 0; local_a50 < 0x12; local_a50 = local_a50 + 1) {
        if ((local_a48 & local_a4c & 1 << ((byte)local_a50 & 0x1f)) != 0) {
          local_a38[(ulong)local_a50 * 0x12 + (ulong)local_a50] = 1.0;
        }
      }
      local_a54 = local_a48 & (local_a4c ^ 0xffffffff);
      if (((local_a54 & 4) != 0) && ((local_a4c & 3) == 3)) {
        if ((local_a48 & 3) == 0) {
          local_a38[2] = local_a38[2] + 0.7071067811865476;
          local_a38[0x14] = local_a38[0x14] + 0.7071067811865476;
        }
        else {
          local_a38[2] = (double)(float)in_RDI[6] + local_a38[2];
          local_a38[0x14] = (double)(float)in_RDI[6] + local_a38[0x14];
        }
      }
      if (((local_a54 & 3) != 0) && ((local_a4c & 4) != 0)) {
        local_a38[0x24] = local_a38[0x24] + 0.7071067811865476;
        local_a38[0x25] = local_a38[0x25] + 0.7071067811865476;
        if ((local_a48 & 4) != 0) {
          local_a38[0x26] = (double)(float)in_RDI[6] * 1.4142135623730951;
        }
      }
      if ((local_a54 & 0x100) != 0) {
        if ((local_a4c & 0x10) == 0) {
          if ((local_a4c & 0x200) == 0) {
            if ((local_a4c & 1) == 0) {
              if ((local_a4c & 4) != 0) {
                local_a38[0x2c] = (double)(float)in_RDI[5] * 0.7071067811865476 + local_a38[0x2c];
              }
            }
            else {
              local_a38[8] = (double)(float)in_RDI[5] * 0.7071067811865476 + local_a38[8];
              local_a38[0x1a] = (double)(float)in_RDI[5] * 0.7071067811865476 + local_a38[0x1a];
            }
          }
          else {
            local_a38[0xaa] = local_a38[0xaa] + 0.7071067811865476;
            local_a38[0xbc] = local_a38[0xbc] + 0.7071067811865476;
          }
        }
        else {
          local_a38[0x50] = local_a38[0x50] + 0.7071067811865476;
          local_a38[0x62] = local_a38[0x62] + 0.7071067811865476;
        }
      }
      if ((local_a54 & 0x10) != 0) {
        if ((local_a4c & 0x100) == 0) {
          if ((local_a4c & 0x200) == 0) {
            if ((local_a4c & 1) == 0) {
              if ((local_a4c & 4) != 0) {
                local_a38[0x28] = (double)(float)in_RDI[5] * 0.7071067811865476 + local_a38[0x28];
                local_a38[0x29] = (double)(float)in_RDI[5] * 0.7071067811865476 + local_a38[0x29];
              }
            }
            else {
              local_a38[4] = (double)(float)in_RDI[5] + local_a38[4];
              local_a38[0x17] = (double)(float)in_RDI[5] + local_a38[0x17];
            }
          }
          else if ((local_a48 & 0x200) == 0) {
            local_a38[0xa6] = local_a38[0xa6] + 1.0;
            local_a38[0xb9] = local_a38[0xb9] + 1.0;
          }
          else {
            local_a38[0xa6] = local_a38[0xa6] + 0.7071067811865476;
            local_a38[0xb9] = local_a38[0xb9] + 0.7071067811865476;
          }
        }
        else {
          local_a38[0x94] = local_a38[0x94] + 0.7071067811865476;
          local_a38[0x95] = local_a38[0x95] + 0.7071067811865476;
        }
      }
      if ((local_a54 & 0x200) != 0) {
        if ((local_a4c & 0x10) == 0) {
          if ((local_a4c & 0x100) == 0) {
            if ((local_a4c & 1) == 0) {
              if ((local_a4c & 4) != 0) {
                local_a38[0x2d] = (double)(float)in_RDI[5] * 0.7071067811865476 + local_a38[0x2d];
                local_a38[0x2e] = (double)(float)in_RDI[5] * 0.7071067811865476 + local_a38[0x2e];
              }
            }
            else {
              local_a38[9] = (double)(float)in_RDI[5] + local_a38[9];
              local_a38[0x1c] = (double)(float)in_RDI[5] + local_a38[0x1c];
            }
          }
          else {
            local_a38[0x99] = local_a38[0x99] + 0.7071067811865476;
            local_a38[0x9a] = local_a38[0x9a] + 0.7071067811865476;
          }
        }
        else if ((local_a48 & 0x10) == 0) {
          local_a38[0x51] = local_a38[0x51] + 1.0;
          local_a38[100] = local_a38[100] + 1.0;
        }
        else {
          local_a38[0x51] = local_a38[0x51] + 0.7071067811865476;
          local_a38[100] = local_a38[100] + 0.7071067811865476;
        }
      }
      if ((local_a54 & 0x40) != 0) {
        if ((local_a4c & 1) == 0) {
          if ((local_a4c & 4) != 0) {
            local_a38[0x2a] = local_a38[0x2a] + 0.7071067811865476;
            local_a38[0x2b] = local_a38[0x2b] + 0.7071067811865476;
          }
        }
        else {
          local_a38[6] = local_a38[6] + 1.0;
          local_a38[0x19] = local_a38[0x19] + 1.0;
        }
      }
      if ((local_a54 & 8) != 0) {
        if ((local_a4c & 4) == 0) {
          if ((local_a4c & 1) != 0) {
            local_a38[3] = (double)(float)in_RDI[7] * 0.7071067811865476 + local_a38[3];
            local_a38[0x15] = (double)(float)in_RDI[7] * 0.7071067811865476 + local_a38[0x15];
          }
        }
        else {
          local_a38[0x27] = (double)(float)in_RDI[7] + local_a38[0x27];
        }
      }
      local_a58 = 0;
      for (local_a5c = 0; local_a5c < 0x20; local_a5c = local_a5c + 1) {
        local_a68 = 0.0;
        local_a6c = 0;
        if ((local_a4c & 1 << ((byte)local_a5c & 0x1f)) != 0) {
          for (local_a70 = 0; local_a70 < 0x20; local_a70 = local_a70 + 1) {
            if ((local_a48 & 1 << ((byte)local_a70 & 0x1f)) != 0) {
              if ((local_a5c < 0x12) && (local_a70 < 0x12)) {
                *(double *)(in_RDI + (ulong)local_a58 * 0x40 + (long)local_a6c * 2 + 8) =
                     local_a38[(ulong)local_a5c * 0x12 + (ulong)local_a70];
              }
              else {
                local_a89 = false;
                if (local_a5c == local_a70) {
                  local_a89 = (local_a48 & local_a4c & 1 << ((byte)local_a5c & 0x1f)) != 0;
                }
                *(double *)(in_RDI + (ulong)local_a58 * 0x40 + (long)local_a6c * 2 + 8) =
                     (double)local_a89;
              }
              local_a68 = ABS(*(double *)
                               (in_RDI + (ulong)local_a58 * 0x40 + (long)local_a6c * 2 + 8)) +
                          local_a68;
              local_a6c = local_a6c + 1;
            }
          }
          pdVar2 = std::max<double>(&local_a40,&local_a68);
          local_a40 = *pdVar2;
          local_a58 = local_a58 + 1;
        }
      }
      if (*in_RDI == 0) {
        local_a44 = 1.0;
      }
      else {
        local_a44 = 2.1474836e+09;
      }
      if ((double)local_a44 < local_a40) {
        for (local_a74 = 0; local_a74 < 0x20; local_a74 = local_a74 + 1) {
          for (local_a78 = 0; local_a78 < 0x20; local_a78 = local_a78 + 1) {
            *(double *)(in_RDI + (ulong)local_a74 * 0x40 + (ulong)local_a78 * 2 + 8) =
                 *(double *)(in_RDI + (ulong)local_a74 * 0x40 + (ulong)local_a78 * 2 + 8) /
                 (local_a40 / (double)local_a44);
          }
        }
      }
      if (*in_RDI == 2) {
        for (local_a7c = 0; local_a7c < 0x20; local_a7c = local_a7c + 1) {
          for (local_a80 = 0; local_a80 < 0x20; local_a80 = local_a80 + 1) {
            in_RDI[(ulong)local_a7c * 0x20 + (ulong)local_a80 + 0x808] =
                 (int)(float)*(double *)
                              (in_RDI + (ulong)local_a7c * 0x40 + (ulong)local_a80 * 2 + 8);
          }
        }
      }
      local_4 = 0;
    }
    else {
      if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Output Layout %x is not supported\n","cubeb_mixer.cpp",0xc1,
                   (ulong)(uint)in_RDI[2]);
      }
      local_4 = -1;
    }
  }
  else {
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
      (*g_cubeb_log_callback)
                ("%s:%d: Input Layout %x is not supported\n","cubeb_mixer.cpp",0xbc,
                 (ulong)(uint)in_RDI[1]);
    }
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int MixerContext::auto_matrix()
{
  double matrix[NUM_NAMED_CHANNELS][NUM_NAMED_CHANNELS] = { { 0 } };
  double maxcoef = 0;
  float maxval;

  cubeb_channel_layout in_ch_layout = clean_layout(_in_ch_layout);
  cubeb_channel_layout out_ch_layout = clean_layout(_out_ch_layout);

  if (!sane_layout(in_ch_layout)) {
    // Channel Not Supported
    LOG("Input Layout %x is not supported", _in_ch_layout);
    return -1;
  }

  if (!sane_layout(out_ch_layout)) {
    LOG("Output Layout %x is not supported", _out_ch_layout);
    return -1;
  }

  for (uint32_t i = 0; i < FF_ARRAY_ELEMS(matrix); i++) {
    if (in_ch_layout & out_ch_layout & (1U << i)) {
      matrix[i][i] = 1.0;
    }
  }

  cubeb_channel_layout unaccounted = in_ch_layout & ~out_ch_layout;

  // Rematrixing is done via a matrix of coefficient that should be applied to
  // all channels. Channels are treated as pair and must be symmetrical (if a
  // left channel exists, the corresponding right should exist too) unless the
  // output layout has similar layout. Channels are then mixed toward the front
  // center or back center if they exist with a slight bias toward the front.

  if (unaccounted & CHANNEL_FRONT_CENTER) {
    if ((out_ch_layout & CUBEB_LAYOUT_STEREO) == CUBEB_LAYOUT_STEREO) {
      if (in_ch_layout & CUBEB_LAYOUT_STEREO) {
        matrix[FRONT_LEFT][FRONT_CENTER] += _center_mix_level;
        matrix[FRONT_RIGHT][FRONT_CENTER] += _center_mix_level;
      } else {
        matrix[FRONT_LEFT][FRONT_CENTER] += M_SQRT1_2;
        matrix[FRONT_RIGHT][FRONT_CENTER] += M_SQRT1_2;
      }
    }
  }
  if (unaccounted & CUBEB_LAYOUT_STEREO) {
    if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][FRONT_LEFT] += M_SQRT1_2;
      matrix[FRONT_CENTER][FRONT_RIGHT] += M_SQRT1_2;
      if (in_ch_layout & CHANNEL_FRONT_CENTER)
        matrix[FRONT_CENTER][FRONT_CENTER] = _center_mix_level * M_SQRT2;
    }
  }

  if (unaccounted & CHANNEL_BACK_CENTER) {
    if (out_ch_layout & CHANNEL_BACK_LEFT) {
      matrix[BACK_LEFT][BACK_CENTER] += M_SQRT1_2;
      matrix[BACK_RIGHT][BACK_CENTER] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_SIDE_LEFT) {
      matrix[SIDE_LEFT][BACK_CENTER] += M_SQRT1_2;
      matrix[SIDE_RIGHT][BACK_CENTER] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][BACK_CENTER] += _surround_mix_level * M_SQRT1_2;
      matrix[FRONT_RIGHT][BACK_CENTER] += _surround_mix_level * M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][BACK_CENTER] +=
        _surround_mix_level * M_SQRT1_2;
    }
  }
  if (unaccounted & CHANNEL_BACK_LEFT) {
    if (out_ch_layout & CHANNEL_BACK_CENTER) {
      matrix[BACK_CENTER][BACK_LEFT] += M_SQRT1_2;
      matrix[BACK_CENTER][BACK_RIGHT] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_SIDE_LEFT) {
      if (in_ch_layout & CHANNEL_SIDE_LEFT) {
        matrix[SIDE_LEFT][BACK_LEFT] += M_SQRT1_2;
        matrix[SIDE_RIGHT][BACK_RIGHT] += M_SQRT1_2;
      } else {
        matrix[SIDE_LEFT][BACK_LEFT] += 1.0;
        matrix[SIDE_RIGHT][BACK_RIGHT] += 1.0;
      }
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][BACK_LEFT] += _surround_mix_level;
      matrix[FRONT_RIGHT][BACK_RIGHT] += _surround_mix_level;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][BACK_LEFT] += _surround_mix_level * M_SQRT1_2;
      matrix[FRONT_CENTER][BACK_RIGHT] += _surround_mix_level * M_SQRT1_2;
    }
  }

  if (unaccounted & CHANNEL_SIDE_LEFT) {
    if (out_ch_layout & CHANNEL_BACK_LEFT) {
      /* if back channels do not exist in the input, just copy side
         channels to back channels, otherwise mix side into back */
      if (in_ch_layout & CHANNEL_BACK_LEFT) {
        matrix[BACK_LEFT][SIDE_LEFT] += M_SQRT1_2;
        matrix[BACK_RIGHT][SIDE_RIGHT] += M_SQRT1_2;
      } else {
        matrix[BACK_LEFT][SIDE_LEFT] += 1.0;
        matrix[BACK_RIGHT][SIDE_RIGHT] += 1.0;
      }
    } else if (out_ch_layout & CHANNEL_BACK_CENTER) {
      matrix[BACK_CENTER][SIDE_LEFT] += M_SQRT1_2;
      matrix[BACK_CENTER][SIDE_RIGHT] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][SIDE_LEFT] += _surround_mix_level;
      matrix[FRONT_RIGHT][SIDE_RIGHT] += _surround_mix_level;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][SIDE_LEFT] += _surround_mix_level * M_SQRT1_2;
      matrix[FRONT_CENTER][SIDE_RIGHT] += _surround_mix_level * M_SQRT1_2;
    }
  }

  if (unaccounted & CHANNEL_FRONT_LEFT_OF_CENTER) {
    if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][FRONT_LEFT_OF_CENTER] += 1.0;
      matrix[FRONT_RIGHT][FRONT_RIGHT_OF_CENTER] += 1.0;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][FRONT_LEFT_OF_CENTER] += M_SQRT1_2;
      matrix[FRONT_CENTER][FRONT_RIGHT_OF_CENTER] += M_SQRT1_2;
    }
  }
  /* mix LFE into front left/right or center */
  if (unaccounted & CHANNEL_LOW_FREQUENCY) {
    if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][LOW_FREQUENCY] += _lfe_mix_level;
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][LOW_FREQUENCY] += _lfe_mix_level * M_SQRT1_2;
      matrix[FRONT_RIGHT][LOW_FREQUENCY] += _lfe_mix_level * M_SQRT1_2;
    }
  }

  // Normalize the conversion matrix.
  for (uint32_t out_i = 0, i = 0; i < CHANNELS_MAX; i++) {
    double sum = 0;
    int in_i = 0;
    if ((out_ch_layout & (1U << i)) == 0) {
      continue;
    }
    for (uint32_t j = 0; j < CHANNELS_MAX; j++) {
      if ((in_ch_layout & (1U << j)) == 0) {
        continue;
      }
      if (i < FF_ARRAY_ELEMS(matrix) && j < FF_ARRAY_ELEMS(matrix[0])) {
        _matrix[out_i][in_i] = matrix[i][j];
      } else {
        _matrix[out_i][in_i] =
          i == j && (in_ch_layout & out_ch_layout & (1U << i));
      }
      sum += fabs(_matrix[out_i][in_i]);
      in_i++;
    }
    maxcoef = std::max(maxcoef, sum);
    out_i++;
  }

  if (_format == CUBEB_SAMPLE_S16NE) {
    maxval = 1.0;
  } else {
    maxval = INT_MAX;
  }

  // Normalize matrix if needed.
  if (maxcoef > maxval) {
    maxcoef /= maxval;
    for (uint32_t i = 0; i < CHANNELS_MAX; i++)
      for (uint32_t j = 0; j < CHANNELS_MAX; j++) {
        _matrix[i][j] /= maxcoef;
      }
  }

  if (_format == CUBEB_SAMPLE_FLOAT32NE) {
    for (uint32_t i = 0; i < FF_ARRAY_ELEMS(_matrix); i++) {
      for (uint32_t j = 0; j < FF_ARRAY_ELEMS(_matrix[0]); j++) {
        _matrix_flt[i][j] = _matrix[i][j];
      }
    }
  }

  return 0;
}